

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

la_int64_t archive_write_disk_gid(archive *_a,char *name,la_int64_t id)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar1;
  int iVar2;
  la_int64_t lVar3;
  
  iVar2 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_gid");
  lVar3 = -0x1e;
  if ((iVar2 != -0x1e) &&
     (UNRECOVERED_JUMPTABLE = (code *)_a[1].error_string.buffer_length, lVar3 = id,
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    uVar1._0_4_ = _a[1].current_codepage;
    uVar1._4_4_ = _a[1].current_oemcp;
    lVar3 = (*UNRECOVERED_JUMPTABLE)(uVar1,name,id);
    return lVar3;
  }
  return lVar3;
}

Assistant:

int64_t
archive_write_disk_gid(struct archive *_a, const char *name, la_int64_t id)
{
       struct archive_write_disk *a = (struct archive_write_disk *)_a;
       archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
           ARCHIVE_STATE_ANY, "archive_write_disk_gid");
       if (a->lookup_gid)
               return (a->lookup_gid)(a->lookup_gid_data, name, id);
       return (id);
}